

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::GetFullNameInternal
          (cmGeneratorTarget *this,string *config,ArtifactType artifact,string *outPrefix,
          string *outBase,string *outSuffix)

{
  cmMakefile *pcVar1;
  string *psVar2;
  bool bVar3;
  TargetType TVar4;
  char *pcVar5;
  ArtifactType artifact_00;
  allocator<char> local_d1;
  string *local_d0;
  string *local_c8;
  char *local_c0;
  string local_b8;
  string *local_98;
  string ll;
  string fw_prefix;
  string configPostfix;
  
  local_c8 = outSuffix;
  TVar4 = GetType(this);
  if ((((TVar4 == STATIC_LIBRARY) || (TVar4 = GetType(this), TVar4 == SHARED_LIBRARY)) ||
      (TVar4 = GetType(this), TVar4 == MODULE_LIBRARY)) ||
     (TVar4 = GetType(this), TVar4 == EXECUTABLE)) {
    if (artifact == ImportLibraryArtifact) {
      pcVar1 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ll,"CMAKE_IMPORT_LIBRARY_SUFFIX",(allocator<char> *)&configPostfix);
      pcVar5 = cmMakefile::GetDefinition(pcVar1,&ll);
      std::__cxx11::string::~string((string *)&ll);
      if (pcVar5 == (char *)0x0) {
        outPrefix->_M_string_length = 0;
        *(outPrefix->_M_dataplus)._M_p = '\0';
        outBase->_M_string_length = 0;
        *(outBase->_M_dataplus)._M_p = '\0';
        local_c8->_M_string_length = 0;
        *(local_c8->_M_dataplus)._M_p = '\0';
        return;
      }
    }
    local_98 = outPrefix;
    GetLinkerLanguage(&ll,this,config);
    GetFilePrefixInternal(this,artifact,&ll);
    local_c0 = GetFileSuffixInternal(this,artifact,&ll);
    TVar4 = GetType(this);
    artifact_00 = artifact;
    if ((TVar4 != SHARED_LIBRARY) && (TVar4 = GetType(this), TVar4 != MODULE_LIBRARY)) {
      TVar4 = GetType(this);
      artifact_00 = RuntimeBinaryArtifact;
      if (TVar4 == EXECUTABLE) {
        artifact_00 = artifact;
      }
    }
    local_d0 = outBase;
    GetFilePostfix(&configPostfix,this,config);
    fw_prefix._M_dataplus._M_p = (pointer)&fw_prefix.field_2;
    fw_prefix._M_string_length = 0;
    fw_prefix.field_2._M_local_buf[0] = '\0';
    bVar3 = IsFrameworkOnApple(this);
    if (bVar3) {
      GetFrameworkDirectory(&local_b8,this,config,ContentLevel);
      std::__cxx11::string::operator=((string *)&fw_prefix,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::append((char *)&fw_prefix);
      local_c0 = (char *)0x0;
    }
    bVar3 = IsCFBundleOnApple(this);
    if (bVar3) {
      GetCFBundleDirectory(&local_b8,this,config,FullLevel);
      std::__cxx11::string::operator=((string *)&fw_prefix,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::append((char *)&fw_prefix);
      local_c0 = (char *)0x0;
    }
    std::__cxx11::string::assign((char *)local_98);
    GetOutputName(&local_b8,this,config,artifact_00);
    psVar2 = local_d0;
    std::__cxx11::string::append((string *)local_d0);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::append((string *)psVar2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"SOVERSION",&local_d1);
    pcVar5 = GetProperty(this,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    if (((pcVar5 != (char *)0x0) && (TVar4 = GetType(this), artifact != ImportLibraryArtifact)) &&
       (TVar4 == SHARED_LIBRARY)) {
      pcVar1 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"CMAKE_SHARED_LIBRARY_NAME_WITH_VERSION",&local_d1);
      bVar3 = cmMakefile::IsOn(pcVar1,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      if (bVar3) {
        std::__cxx11::string::append((char *)local_d0);
        std::__cxx11::string::append((char *)local_d0);
      }
    }
    std::__cxx11::string::assign((char *)local_c8);
    std::__cxx11::string::~string((string *)&fw_prefix);
    std::__cxx11::string::~string((string *)&configPostfix);
    std::__cxx11::string::~string((string *)&ll);
  }
  else {
    outPrefix->_M_string_length = 0;
    *(outPrefix->_M_dataplus)._M_p = '\0';
    GetName_abi_cxx11_(this);
    std::__cxx11::string::_M_assign((string *)outBase);
    local_c8->_M_string_length = 0;
    *(local_c8->_M_dataplus)._M_p = '\0';
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetFullNameInternal(
  const std::string& config, cmStateEnums::ArtifactType artifact,
  std::string& outPrefix, std::string& outBase, std::string& outSuffix) const
{
  // Use just the target name for non-main target types.
  if (this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    outPrefix.clear();
    outBase = this->GetName();
    outSuffix.clear();
    return;
  }

  const bool isImportedLibraryArtifact =
    (artifact == cmStateEnums::ImportLibraryArtifact);

  // Return an empty name for the import library if this platform
  // does not support import libraries.
  if (isImportedLibraryArtifact &&
      !this->Makefile->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX")) {
    outPrefix.clear();
    outBase.clear();
    outSuffix.clear();
    return;
  }

  // retrieve prefix and suffix
  std::string ll = this->GetLinkerLanguage(config);
  const char* targetPrefix = this->GetFilePrefixInternal(artifact, ll);
  const char* targetSuffix = this->GetFileSuffixInternal(artifact, ll);

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    artifact = cmStateEnums::RuntimeBinaryArtifact;
  }

  // Compute the full name for main target types.
  const std::string configPostfix = this->GetFilePostfix(config);

  // frameworks have directory prefix but no suffix
  std::string fw_prefix;
  if (this->IsFrameworkOnApple()) {
    fw_prefix = this->GetFrameworkDirectory(config, ContentLevel);
    fw_prefix += "/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = nullptr;
  }

  if (this->IsCFBundleOnApple()) {
    fw_prefix = this->GetCFBundleDirectory(config, FullLevel);
    fw_prefix += "/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = nullptr;
  }

  // Begin the final name with the prefix.
  outPrefix = targetPrefix ? targetPrefix : "";

  // Append the target name or property-specified name.
  outBase += this->GetOutputName(config, artifact);

  // Append the per-configuration postfix.
  outBase += configPostfix;

  // Name shared libraries with their version number on some platforms.
  if (const char* soversion = this->GetProperty("SOVERSION")) {
    if (this->GetType() == cmStateEnums::SHARED_LIBRARY &&
        !isImportedLibraryArtifact &&
        this->Makefile->IsOn("CMAKE_SHARED_LIBRARY_NAME_WITH_VERSION")) {
      outBase += "-";
      outBase += soversion;
    }
  }

  // Append the suffix.
  outSuffix = targetSuffix ? targetSuffix : "";
}